

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5HashQuery(Fts5Hash *pHash,int nPre,char *pTerm,int nTerm,void **ppOut,int *pnDoclist)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Fts5HashEntry *pFaux;
  u8 *pRet;
  int nList;
  int nHashPre;
  Fts5HashEntry *p;
  char *zKey;
  uint iHash;
  int *pnDoclist_local;
  void **ppOut_local;
  int nTerm_local;
  char *pTerm_local;
  int nPre_local;
  Fts5Hash *pHash_local;
  
  uVar1 = fts5HashKey(pHash->nSlot,(u8 *)pTerm,nTerm);
  _nList = pHash->aSlot[uVar1];
  while ((_nList != (Fts5HashEntry *)0x0 &&
         ((nTerm != _nList->nKey + 1 || (iVar2 = memcmp(_nList + 1,pTerm,(long)nTerm), iVar2 != 0)))
         )) {
    _nList = _nList->pHashNext;
  }
  if (_nList == (Fts5HashEntry *)0x0) {
    *ppOut = (void *)0x0;
    *pnDoclist = 0;
  }
  else {
    iVar2 = nTerm + 0x31;
    iVar3 = _nList->nData - iVar2;
    pvVar4 = sqlite3_malloc64((long)(nPre + iVar3 + 10));
    *ppOut = pvVar4;
    if (pvVar4 == (void *)0x0) {
      *pnDoclist = 0;
      return 7;
    }
    memcpy((void *)((long)pvVar4 + (long)nPre),(void *)((long)&_nList->pHashNext + (long)iVar2),
           (long)iVar3);
    iVar2 = fts5HashAddPoslistSize
                      (pHash,_nList,(Fts5HashEntry *)((long)pvVar4 + (long)(nPre - iVar2)));
    *pnDoclist = iVar2 + iVar3;
  }
  return 0;
}

Assistant:

static int sqlite3Fts5HashQuery(
  Fts5Hash *pHash,                /* Hash table to query */
  int nPre,
  const char *pTerm, int nTerm,   /* Query term */
  void **ppOut,                   /* OUT: Pointer to new object */
  int *pnDoclist                  /* OUT: Size of doclist in bytes */
){
  unsigned int iHash = fts5HashKey(pHash->nSlot, (const u8*)pTerm, nTerm);
  char *zKey = 0;
  Fts5HashEntry *p;

  for(p=pHash->aSlot[iHash]; p; p=p->pHashNext){
    zKey = fts5EntryKey(p);
    assert( p->nKey+1==(int)strlen(zKey) );
    if( nTerm==p->nKey+1 && memcmp(zKey, pTerm, nTerm)==0 ) break;
  }

  if( p ){
    int nHashPre = sizeof(Fts5HashEntry) + nTerm + 1;
    int nList = p->nData - nHashPre;
    u8 *pRet = (u8*)(*ppOut = sqlite3_malloc64(nPre + nList + 10));
    if( pRet ){
      Fts5HashEntry *pFaux = (Fts5HashEntry*)&pRet[nPre-nHashPre];
      memcpy(&pRet[nPre], &((u8*)p)[nHashPre], nList);
      nList += fts5HashAddPoslistSize(pHash, p, pFaux);
      *pnDoclist = nList;
    }else{
      *pnDoclist = 0;
      return SQLITE_NOMEM;
    }
  }else{
    *ppOut = 0;
    *pnDoclist = 0;
  }

  return SQLITE_OK;
}